

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgbaFloat<float> *
qt_fetch_conical_gradient_template<GradientBaseFP,QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,QSpanData *data,int y,int x,int length)

{
  long lVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QRgbaFloat<float> *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  Type TVar3;
  qreal angle_1;
  qreal rw;
  qreal angle;
  QRgbaFloat<float> *end;
  qreal inv2pi;
  bool affine;
  qreal ry;
  qreal rx;
  QRgbaFloat<float> *b;
  QGradientData *in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  double local_88;
  QRgbaFloat<float> *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if ((*(double *)(in_RSI + 0x48) == 0.0) && (!NAN(*(double *)(in_RSI + 0x48)))) {
    bVar2 = *(double *)(in_RSI + 0x60) == 0.0;
  }
  local_30 = in_RDI;
  if (bVar2) {
    for (; local_30 < in_RDI + in_R8D; local_30 = local_30 + 1) {
      qAtan2<double,double>(in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
      TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff58,5.85409144729716e-317);
      local_18 = TVar3._0_8_;
      local_30->r = (float)(undefined4)local_18;
      local_30->g = (float)local_18._4_4_;
      local_10 = TVar3._8_8_;
      local_30->b = (float)(undefined4)local_10;
      local_30->a = (float)local_10._4_4_;
    }
  }
  else {
    local_88 = *(double *)(in_RSI + 0x48) * ((double)in_ECX + 0.5) +
               *(double *)(in_RSI + 0x60) * ((double)in_EDX + 0.5) + *(double *)(in_RSI + 0x68);
    if ((local_88 == 0.0) && (!NAN(local_88))) {
      local_88 = 1.0;
    }
    for (; local_30 < in_RDI + in_R8D; local_30 = local_30 + 1) {
      qAtan2<double,double>(in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58);
      TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff58,5.85427968630822e-317);
      local_28 = TVar3._0_8_;
      local_30->r = (float)(undefined4)local_28;
      local_30->g = (float)local_28._4_4_;
      local_20 = TVar3._8_8_;
      local_30->b = (float)(undefined4)local_20;
      local_30->a = (float)local_20._4_4_;
      local_88 = *(double *)(in_RSI + 0x48) + local_88;
      if ((local_88 == 0.0) && (!NAN(local_88))) {
        local_88 = *(double *)(in_RSI + 0x48) + local_88;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static inline const BlendType * QT_FASTCALL qt_fetch_conical_gradient_template(
        BlendType *buffer, const QSpanData *data,
        int y, int x, int length)
{
    const BlendType *b = buffer;
    qreal rx = data->m21 * (y + qreal(0.5))
               + data->dx + data->m11 * (x + qreal(0.5));
    qreal ry = data->m22 * (y + qreal(0.5))
               + data->dy + data->m12 * (x + qreal(0.5));
    bool affine = !data->m13 && !data->m23;

    const qreal inv2pi = M_1_PI / 2.0;

    const BlendType *end = buffer + length;
    if (affine) {
        rx -= data->gradient.conical.center.x;
        ry -= data->gradient.conical.center.y;
        while (buffer < end) {
            qreal angle = qAtan2(ry, rx) + data->gradient.conical.angle;

            *buffer = GradientBase::fetchSingle(data->gradient, 1 - angle * inv2pi);

            rx += data->m11;
            ry += data->m12;
            ++buffer;
        }
    } else {
        qreal rw = data->m23 * (y + qreal(0.5))
                   + data->m33 + data->m13 * (x + qreal(0.5));
        if (!rw)
            rw = 1;
        while (buffer < end) {
            qreal angle = qAtan2(ry/rw - data->gradient.conical.center.x,
                                rx/rw - data->gradient.conical.center.y)
                          + data->gradient.conical.angle;

            *buffer = GradientBase::fetchSingle(data->gradient, 1 - angle * inv2pi);

            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
    return b;
}